

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::vectorsEqual<CoreML::Specification::Int64Vector>
               (Int64Vector *a,Int64Vector *b)

{
  int iVar1;
  int iVar2;
  int64 iVar3;
  int64 iVar4;
  int local_24;
  int i;
  Int64Vector *b_local;
  Int64Vector *a_local;
  
  iVar1 = Int64Vector::vector_size(a);
  iVar2 = Int64Vector::vector_size(b);
  if (iVar1 == iVar2) {
    for (local_24 = 0; iVar1 = Int64Vector::vector_size(a), local_24 < iVar1;
        local_24 = local_24 + 1) {
      iVar3 = Int64Vector::vector(a,local_24);
      iVar4 = Int64Vector::vector(b,local_24);
      if (iVar3 != iVar4) {
        return false;
      }
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool vectorsEqual(const T& a, const T& b) {
            if (a.vector_size() != b.vector_size()) {
                return false;
            }
            for (int i=0; i<a.vector_size(); i++) {
                if (a.vector(i) != b.vector(i)) {
                    return false;
                }
            }
            return true;
        }